

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revsurface.hpp
# Opt level: O3

void __thiscall RevSurface::RevSurface(RevSurface *this,Json *json)

{
  value_t vVar1;
  bool bVar2;
  const_reference pvVar3;
  reference other;
  Curve *this_00;
  vec3f vVar4;
  vector<vec3f,_std::allocator<vec3f>_> controls;
  const_iterator __begin1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  p;
  value_type curvetype;
  vector<vec3f,_std::allocator<vec3f>_> local_c8;
  vec3f local_a8;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_98;
  RevSurface *local_78;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_70;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  (this->super_ParamSurface).super_Primitive._vptr_Primitive = (_func_int **)&PTR_intersect_0016a288
  ;
  local_78 = this;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)json,"curve");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar3,"type");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_40,pvVar3);
  local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_finish = (vec3f *)0x0;
  local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (vec3f *)0x0;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)json,"curve");
  local_98.m_object =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   *)pvVar3,"controls");
  local_98.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_98.m_it.array_iterator._M_current = (pointer)0x0;
  local_98.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar1 = (local_98.m_object)->m_type;
  if (vVar1 == null) {
    local_98.m_it.primitive_iterator.m_it = 1;
  }
  else {
    if (vVar1 == array) {
      local_98.m_it.array_iterator._M_current =
           ((((local_98.m_object)->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_70.m_it.array_iterator._M_current =
           ((((local_98.m_object)->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00131743;
    }
    if (vVar1 == object) {
      local_98.m_it.object_iterator._M_node =
           ((((local_98.m_object)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header.
           _M_left;
      local_70.m_it.array_iterator._M_current = (pointer)0x0;
      local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_70.m_it.object_iterator._M_node =
           &((((local_98.m_object)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      goto LAB_00131743;
    }
    local_98.m_it.primitive_iterator.m_it = 0;
  }
  local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_70.m_it.array_iterator._M_current = (pointer)0x0;
  local_70.m_it.primitive_iterator.m_it = 1;
LAB_00131743:
  local_70.m_object = local_98.m_object;
  while( true ) {
    bVar2 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==(&local_98,&local_70);
    if (bVar2) break;
    other = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator*(&local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_50,other);
    vVar4 = json2vec3f((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_50);
    local_a8.z = vVar4.z;
    local_a8._0_8_ = vVar4._0_8_;
    if (local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<vec3f,_std::allocator<vec3f>_>::_M_realloc_insert<vec3f>
                (&local_c8,
                 (iterator)
                 local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_a8);
    }
    else {
      (local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish)->z = local_a8.z;
      (local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish)->x = local_a8.x;
      (local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish)->y = local_a8.y;
      local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_50 + 8),local_50[0]);
    if ((local_98.m_object)->m_type == array) {
      local_98.m_it.array_iterator._M_current = local_98.m_it.array_iterator._M_current + 1;
    }
    else if ((local_98.m_object)->m_type == object) {
      local_98.m_it.object_iterator._M_node =
           (_Base_ptr)std::_Rb_tree_increment(local_98.m_it.object_iterator._M_node);
    }
    else {
      local_98.m_it.primitive_iterator.m_it = local_98.m_it.primitive_iterator.m_it + 1;
    }
  }
  bVar2 = nlohmann::operator==<const_char_*,_0>((const_reference)local_40,"Bspline");
  if (bVar2) {
    this_00 = (Curve *)operator_new(0x20);
    BsplineCurve::BsplineCurve((BsplineCurve *)this_00,&local_c8);
    local_78->curve = this_00;
  }
  ParamSurface::buildmesh(&local_78->super_ParamSurface);
  if (local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_40 + 8),local_40[0]);
  return;
}

Assistant:

RevSurface(const Json& json)
	{
		auto curvetype = json["curve"]["type"];
		std::vector<vec3f> controls;
		for (auto p: json["curve"]["controls"])
			controls.push_back(json2vec3f(p));
		if (curvetype == "Bspline")
			curve = new BsplineCurve(controls);
		buildmesh();
	}